

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void initialize_impute_calc<ImputedData<unsigned_long,double>,PredictionData<double,unsigned_long>>
               (ImputedData<unsigned_long,_double> *imp,
               PredictionData<double,_unsigned_long> *prediction_data,Imputer *imputer,size_t row)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  size_t *psVar2;
  double *pdVar3;
  pointer puVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  int *piVar8;
  pointer pvVar9;
  pointer pdVar10;
  value_type_conflict in_RAX;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  pointer pdVar14;
  vector<double,_std::allocator<double>_> *this;
  long lVar15;
  size_t __n;
  size_t col;
  size_t sVar16;
  value_type_conflict local_38;
  
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  imp->n_missing_sp = 0;
  local_38 = in_RAX;
  if (prediction_data->numeric_data == (double *)0x0) {
    if (prediction_data->Xr == (double *)0x0) goto LAB_002501c9;
    if ((imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&imp->missing_sp,imputer->ncols_numeric);
    }
    puVar6 = prediction_data->Xr_indptr;
    uVar11 = puVar6[row];
    if (uVar11 < puVar6[row + 1]) {
      pdVar3 = prediction_data->Xr;
      puVar7 = prediction_data->Xr_ind;
      puVar4 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar3[uVar11])) {
          uVar13 = puVar7[uVar11];
          sVar5 = imp->n_missing_sp;
          imp->n_missing_sp = sVar5 + 1;
          puVar4[sVar5] = uVar13;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < puVar6[row + 1]);
    }
    pdVar14 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar14) {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&imp->sp_num_sum,imputer->ncols_numeric,&local_38);
      this = &imp->sp_num_weight;
      goto LAB_002501ba;
    }
    if (imp->n_missing_sp == 0) goto LAB_002501c9;
    __n = imp->n_missing_sp << 3;
    memset(pdVar14,0,__n);
    pdVar14 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    pvVar1 = &imp->missing_num;
    if ((imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar1,imputer->ncols_numeric);
    }
    psVar2 = &imp->n_missing_num;
    uVar11 = imputer->ncols_numeric;
    if (prediction_data->is_col_major == false) {
      if (uVar11 != 0) {
        pdVar3 = prediction_data->numeric_data;
        puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar13 = 0;
        do {
          if (0x7fefffffffffffff <
              (*(ulong *)((long)pdVar3 + uVar13 * 8 + uVar11 * row * 8) & 0x7fffffffffffffff)) {
            sVar5 = *psVar2;
            *psVar2 = sVar5 + 1;
            puVar4[sVar5] = uVar13;
          }
          uVar13 = uVar13 + 1;
          uVar11 = imputer->ncols_numeric;
        } while (uVar13 < uVar11);
      }
    }
    else if (uVar11 != 0) {
      pdVar3 = prediction_data->numeric_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar3[row + prediction_data->nrows * uVar11])) {
          sVar5 = *psVar2;
          *psVar2 = sVar5 + 1;
          puVar4[sVar5] = uVar11;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < imputer->ncols_numeric);
    }
    pdVar14 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar14) {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&imp->num_sum,imputer->ncols_numeric,&local_38);
      this = &imp->num_weight;
LAB_002501ba:
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(this,imputer->ncols_numeric,&local_38);
      goto LAB_002501c9;
    }
    if (*psVar2 == 0) goto LAB_002501c9;
    __n = *psVar2 << 3;
    memset(pdVar14,0,__n);
    pdVar14 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  memset(pdVar14,0,__n);
LAB_002501c9:
  if (prediction_data->categ_data != (int *)0x0) {
    pvVar1 = &imp->missing_cat;
    if ((imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar1,imputer->ncols_categ);
    }
    uVar11 = imputer->ncols_categ;
    if (prediction_data->is_col_major == false) {
      if (uVar11 != 0) {
        piVar8 = prediction_data->categ_data;
        puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar12 = 0;
        do {
          if (*(int *)((long)piVar8 + uVar12 * 4 + uVar11 * row * 4) < 0) {
            sVar5 = imp->n_missing_cat;
            imp->n_missing_cat = sVar5 + 1;
            puVar4[sVar5] = uVar12;
          }
          uVar12 = uVar12 + 1;
          uVar11 = imputer->ncols_categ;
        } while (uVar12 < uVar11);
      }
    }
    else if (uVar11 != 0) {
      piVar8 = prediction_data->categ_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        if (piVar8[row + prediction_data->nrows * uVar11] < 0) {
          sVar5 = imp->n_missing_cat;
          imp->n_missing_cat = sVar5 + 1;
          puVar4[sVar5] = uVar11;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < imputer->ncols_categ);
    }
    pdVar14 = (imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar14) {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&imp->cat_weight,imputer->ncols_categ,&local_38);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&imp->cat_sum,imputer->ncols_categ);
      if (imputer->ncols_categ != 0) {
        lVar15 = 0;
        uVar11 = 0;
        do {
          local_38 = 0.0;
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     ((long)&(((imp->cat_sum).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar15),
                     (long)(imputer->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar11],&local_38);
          uVar11 = uVar11 + 1;
          lVar15 = lVar15 + 0x18;
        } while (uVar11 < imputer->ncols_categ);
      }
    }
    else {
      sVar5 = imp->n_missing_cat;
      if (sVar5 != 0) {
        sVar16 = 0;
        memset(pdVar14,0,sVar5 * 8);
        pvVar9 = (imp->cat_sum).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (imp->missing_cat).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          uVar13 = puVar4[sVar16];
          pdVar14 = pvVar9[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar10 = *(pointer *)
                     ((long)&pvVar9[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + 8);
          if (pdVar14 != pdVar10) {
            memset(pdVar14,0,((long)pdVar10 + (-8 - (long)pdVar14) & 0xfffffffffffffff8U) + 8);
          }
          sVar16 = sVar16 + 1;
        } while (sVar5 != sVar16);
      }
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, PredictionData &prediction_data, Imputer &imputer, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (prediction_data.numeric_data != NULL)
    {
        if (!imp.missing_num.size())
            imp.missing_num.resize(imputer.ncols_numeric);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        if (!imp.num_sum.size())
        {
            imp.num_sum.resize(imputer.ncols_numeric,    0);
            imp.num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.num_sum.begin(),     imp.num_sum.begin()    + imp.n_missing_num,  0);
            std::fill(imp.num_weight.begin(),  imp.num_weight.begin() + imp.n_missing_num,  0);
        }
    }

    else if (prediction_data.Xr != NULL)
    {
        if (!imp.missing_sp.size())
            imp.missing_sp.resize(imputer.ncols_numeric);
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            if (is_na_or_inf(prediction_data.Xr[ix]))
                imp.missing_sp[imp.n_missing_sp++] = prediction_data.Xr_ind[ix];

        if (!imp.sp_num_sum.size())
        {
            imp.sp_num_sum.resize(imputer.ncols_numeric,    0);
            imp.sp_num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.sp_num_sum.begin(),     imp.sp_num_sum.begin()    + imp.n_missing_sp,  0);
            std::fill(imp.sp_num_weight.begin(),  imp.sp_num_weight.begin() + imp.n_missing_sp,  0);
        }
    }
    
    if (prediction_data.categ_data != NULL)
    {
        if (!imp.missing_cat.size())
            imp.missing_cat.resize(imputer.ncols_categ);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        if (!imp.cat_weight.size())
        {
            imp.cat_weight.resize(imputer.ncols_categ, 0);
            imp.cat_sum.resize(imputer.ncols_categ);
            for (size_t col = 0; col < imputer.ncols_categ; col++)
                imp.cat_sum[col].resize(imputer.ncat[col], 0);
        }

        else
        {
            std::fill(imp.cat_weight.begin(), imp.cat_weight.begin() + imp.n_missing_cat, 0);
            for (size_t col = 0; col < imp.n_missing_cat; col++)
                std::fill(imp.cat_sum[imp.missing_cat[col]].begin(),
                          imp.cat_sum[imp.missing_cat[col]].end(),
                          0);
        }
    }
}